

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

bool __thiscall chrono::ChOptimizerGradient::DoOptimize(ChOptimizerGradient *this)

{
  Scalar SVar1;
  bool bVar2;
  Scalar *pSVar3;
  char *__format;
  int i;
  long lVar4;
  int iVar5;
  undefined1 auVar6 [16];
  RealScalar RVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int nv;
  ChVectorDynamic<> mG;
  ChVectorDynamic<> mXmid;
  ChVectorDynamic<> mX2;
  ChVectorDynamic<> mX1;
  ChVectorDynamic<> mXguess;
  ChVectorDynamic<> mX;
  ChVectorDynamic<> mGcnold;
  ChVectorDynamic<> mGcn;
  double local_168;
  int local_15c;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  Matrix<double,__1,_1,_0,__1,_1> local_128;
  Matrix<double,__1,_1,_0,__1,_1> local_118;
  Matrix<double,__1,_1,_0,__1,_1> local_108;
  Matrix<double,__1,_1,_0,__1,_1> local_f8;
  Matrix<double,__1,_1,_0,__1,_1> local_e8;
  Matrix<double,__1,_1,_0,__1,_1> local_d8;
  RealScalar local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_c0;
  Matrix<double,__1,_1,_0,__1,_1> local_b0;
  double local_a0 [6];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_70;
  
  local_15c = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  local_138 = this->initial_step;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_d8,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_e8,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_128,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_b0,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_c0,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_118,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_f8,&local_15c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_108,&local_15c);
  for (lVar4 = 0; lVar4 < local_15c; lVar4 = lVar4 + 1) {
    SVar1 = (this->super_ChOptimizer).xv[lVar4];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_d8,
                        lVar4);
    *pSVar3 = SVar1;
  }
  local_148 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,&local_d8);
  local_140 = 0.0;
  local_150 = 0.0;
  local_158 = 0.0;
  local_c8 = 0.0;
  do {
    ChOptimizer::Eval_grad(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_d8,&local_128);
    if (this->do_conjugate == true) {
      RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_b0,&local_128);
      if (1 < (this->super_ChOptimizer).grad_evaluations) {
        local_a0[0] = RVar7 / local_c8;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                          *)&local_70,local_a0,(StorageBaseType *)&local_c0);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_70);
      }
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_c0,&local_b0);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_128,&local_b0);
      local_c8 = RVar7;
    }
    dVar8 = local_148;
    for (iVar5 = 0; iVar5 <= this->maxdilationsteps; iVar5 = iVar5 + 1) {
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_a0,&local_138,(StorageBaseType *)&local_128);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_a0);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&local_e8,&local_70);
      local_140 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,&local_e8);
      if (local_140 <= dVar8) break;
      local_138 = local_138 * this->dilation;
      dVar8 = local_140;
    }
    local_130 = local_138 * 0.5;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_a0,&local_130,(StorageBaseType *)&local_128);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_118,&local_70);
    local_168 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,&local_118);
    iVar5 = 0;
LAB_00d24676:
    if ((this->maxbisections < iVar5) ||
       ((long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations)) goto LAB_00d24897;
    local_130 = local_138 * 0.25;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_a0,&local_130,(StorageBaseType *)&local_128);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_f8,&local_70);
    local_150 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,&local_f8);
    local_130 = local_138 * 0.75;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_a0,&local_130,(StorageBaseType *)&local_128);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_108,&local_70);
    local_158 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,&local_108);
    bVar2 = false;
    if ((local_150 <= local_168) && (bVar2 = false, local_168 <= local_158)) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_d8,&local_118);
      bVar2 = true;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_118,&local_108);
      local_148 = local_168;
      local_168 = local_158;
    }
    if (((local_168 <= local_150) && (local_158 <= local_168)) && (!bVar2)) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_e8,&local_118);
      bVar2 = true;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_118,&local_f8);
      local_140 = local_168;
      local_168 = local_150;
    }
    if ((local_150 <= local_168) && (local_158 <= local_168)) {
      if (!bVar2) {
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  (&local_d8,&local_f8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  (&local_e8,&local_108);
        local_140 = local_158;
        local_148 = local_150;
      }
LAB_00d24840:
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_168 - local_148;
      auVar6 = vandpd_avx512vl(auVar9,auVar6);
      if (auVar6._0_8_ <= this->fun_tol) {
        builtin_strncpy((this->super_ChOptimizer).err_message,"OK,function tolerance reached.",0x1f)
        ;
        goto LAB_00d24a18;
      }
      iVar5 = iVar5 + 1;
      local_138 = local_138 * 0.5;
      goto LAB_00d24676;
    }
    if (bVar2) goto LAB_00d24840;
    local_138 = local_138 * 0.25;
LAB_00d24897:
    if (((local_148 <= local_150) && (local_168 <= local_150)) &&
       ((local_158 <= local_150 && (local_140 <= local_150)))) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_d8,&local_f8);
    }
    if ((((local_150 <= local_158) && (local_148 <= local_158)) && (local_168 <= local_158)) &&
       (local_140 <= local_158)) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_d8,&local_108);
    }
    if (((local_148 <= local_168) && (local_150 <= local_168)) &&
       ((local_158 <= local_168 && (local_140 <= local_168)))) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_d8,&local_118);
    }
    if (((local_148 <= local_140) && (local_150 <= local_140)) &&
       ((local_168 <= local_140 && (local_158 <= local_140)))) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_d8,&local_e8);
    }
    local_148 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_d8);
    if ((long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations) {
      lVar4 = (this->super_ChOptimizer).grad_evaluations;
      __format = "OK, limit on max number of fx evaluations reached in %ld steps";
      goto LAB_00d24ade;
    }
    lVar4 = (this->super_ChOptimizer).grad_evaluations;
    if (this->maxgradients < lVar4) {
      __format = "OK, limit on max number of %ld gradient evaluations reached.";
LAB_00d24ade:
      sprintf((this->super_ChOptimizer).err_message,__format,lVar4);
LAB_00d24a18:
      (this->super_ChOptimizer).opt_fx = local_148;
      if ((this->super_ChOptimizer).C_vars != 0) {
        for (lVar4 = 0; lVar4 < local_15c; lVar4 = lVar4 + 1) {
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &local_d8,lVar4);
          (this->super_ChOptimizer).xv[lVar4] = *pSVar3;
        }
      }
      Eigen::internal::handmade_aligned_free
                (local_108.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_118.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_c0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      return true;
    }
  } while( true );
}

Assistant:

bool ChOptimizerGradient::DoOptimize() {
    double nstep = initial_step;
    int dilationstep;
    int bisections;
    double fx, fxguess = 0, fxmid, fx1 = 0, fx2 = 0, lastgood, normGold = 0, normGnew;

    // count vars
    int nv = GetNumOfVars();

    nstep = initial_step;

    // allocate variables vector
    ChVectorDynamic<> mX(nv);       // the variables
    ChVectorDynamic<> mXguess(nv);  // the guessed variables
    ChVectorDynamic<> mG(nv);       // the gradient
    ChVectorDynamic<> mGcn(nv);     // the conjugate gradient
    ChVectorDynamic<> mGcnold(nv);  // the old conjugate gradient
    ChVectorDynamic<> mXmid(nv);    // the bisection center
    ChVectorDynamic<> mX1(nv);      // the bisection left
    ChVectorDynamic<> mX2(nv);      // the bisection right

    // populate vector with starting approximation
    // system->vector

    for (int i = 0; i < nv; i++) {
        mX(i) = xv[i];
    };
    // System_to_Vars(&mX);

    fx = Eval_fx(mX);

    // perform iterative optimization..

    while (true) {
        // compute gradient here;
        Eval_grad(mX, mG);

        // correction for conjugate gradient method?
        if (do_conjugate) {
            normGnew = mG.norm();
            mGcn = mG;
            if (grad_evaluations > 1) {
                mGcn += (normGnew / normGold) * mGcnold;  // update conj.gradient direction
            }
            mGcnold = mGcn;
            normGold = normGnew;
            mG = mGcn;  // use the conjugate gradient!
        }

        // Forward dilation search;
        dilationstep = 0;
        lastgood = fx;
        while (true) {
            if (dilationstep > maxdilationsteps)
                break;
            dilationstep++;

            // compute new fx position;
            mXguess = mX + nstep * mG;

            fxguess = Eval_fx(mXguess);

            if (fxguess <= lastgood) {
                break;
            }

            nstep *= dilation;
            lastgood = fxguess;
        }

        // Backward bisection search;
        bisections = 0;
        bool gone;

        mXmid = mX + (nstep * 0.5) * mG; // initialize mid

        fxmid = Eval_fx(mXmid);

        while (true) {
            if (bisections > maxbisections)
                break;
            bisections++;
            if (fx_evaluations > maxevaluations)
                break;

            mX1 = mX + (nstep * 0.25) * mG; // initialize left
            fx1 = Eval_fx(mX1);

            mX2 = mX + (nstep * 0.75) * mG; // initialize right
            fx2 = Eval_fx(mX2);

            gone = false;
            if ((fx1 <= fxmid) && (fxmid <= fx2) && !gone) {
                mX = mXmid;
                fx = fxmid;
                mXmid = mX2;
                fxmid = fx2;
                gone = true;
            }
            if ((fx1 >= fxmid) && (fxmid >= fx2) && !gone) {
                mXguess = mXmid;
                fxguess = fxmid;
                mXmid = mX1;
                fxmid = fx1;
                gone = true;
            }
            if ((fx1 <= fxmid) && (fxmid >= fx2) && !gone) {
                mX = mX1;
                fx = fx1;
                mXguess = mX2;
                fxguess = fx2;
                gone = true;
            }
            if (!gone) {
                nstep *= 0.25;
                break;
            }

            if (fabs(fxmid - fx) <= fun_tol) {
                // cout << "\n              ---- ";
                sprintf(err_message, "OK,function tolerance reached.");
                goto end_opt;
            }
            // ***TO DO*** stop after "arg_tol" passed

            // half step, then repeat
            nstep *= 0.5;
        }

        if ((fx1 >= fx) && (fx1 >= fxmid) && (fx1 >= fx2) && (fx1 >= fxguess))
            mX = mX1;
        if ((fx2 >= fx) && (fx2 >= fxmid) && (fx2 >= fx1) && (fx2 >= fxguess))
            mX = mX2;
        if ((fxmid >= fx) && (fxmid >= fx1) && (fxmid >= fx2) && (fxmid >= fxguess))
            mX = mXmid;
        if ((fxguess >= fx) && (fxguess >= fx1) && (fxguess >= fx2) && (fxguess >= fxmid))
            mX = mXguess;

        fx = Eval_fx(mX);

        if (fx_evaluations > maxevaluations) {
            // cout << "\n          limit on fx evals----= ";
            sprintf(err_message, "OK, limit on max number of fx evaluations reached in %ld steps",
                    (long)grad_evaluations);
            break;
        }
        if (grad_evaluations > maxgradients) {
            // cout << "\n          limit on max gradients ---- ";
            sprintf(err_message, "OK, limit on max number of %ld gradient evaluations reached.",
                    (long)grad_evaluations);
            break;
        }
    }

    goto end_opt;

end_opt:
    // ***TO DO*** set the system at best variables among fx, fxguess, fx1, fx2;
    opt_fx = fx;

    if (C_vars) {
        for (int i = 0; i < nv; i++) {
            xv[i] = mX(i);
        };
    }  // copy result into vector xv

    return true;
}